

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall google::protobuf::DynamicMessage::SharedCtor(DynamicMessage *this,bool lock_factory)

{
  FieldDescriptor *this_00;
  Descriptor *pDVar1;
  long lVar2;
  DynamicMessageFactory *this_01;
  undefined8 *puVar3;
  bool bVar4;
  byte bVar5;
  CppStringType CVar6;
  long lVar7;
  Descriptor *pDVar8;
  FieldDescriptor *pFVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  EnumValueDescriptor *pEVar10;
  Message *default_entry;
  Message *mapped_default_entry_if_message;
  TypeInfo *extraout_RAX;
  TypeInfo *pTVar11;
  int iVar12;
  int iVar13;
  code *cleanup;
  ArenaStringPtr *asp;
  DynamicMapField *this_02;
  undefined7 in_register_00000031;
  long lVar14;
  string_view src;
  ThreadSafeArena *local_58;
  undefined1 local_50 [32];
  
  local_50._20_4_ = (int)CONCAT71(in_register_00000031,lock_factory);
  local_58 = (ThreadSafeArena *)(this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  pTVar11 = this->type_info_;
  pDVar1 = (pTVar11->class_data).descriptor;
  if (((ulong)local_58 & 1) != 0) goto LAB_00f41b0f;
  do {
    if (0 < pDVar1->real_oneof_decl_count_) {
      iVar12 = 0;
      iVar13 = 0;
      do {
        iVar13 = iVar13 + 1;
        *(undefined4 *)
         ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
         (long)(pTVar11->oneof_case_offset + iVar12)) = 0;
        iVar12 = iVar12 + 4;
      } while (iVar13 < pDVar1->real_oneof_decl_count_);
    }
    lVar7 = (long)pTVar11->extensions_offset;
    if (lVar7 != -1) {
      *(ThreadSafeArena **)
       ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite + lVar7) = local_58;
      *(undefined4 *)
       ((long)&(this->super_Message).super_MessageLite._internal_metadata_.ptr_ + lVar7) = 0;
      *(undefined8 *)((long)&this->type_info_ + lVar7) = 0;
    }
    if (pDVar1->field_count_ < 1) {
      return;
    }
    lVar7 = 0;
    lVar14 = 0;
    while (pFVar9 = pDVar1->fields_, ((&pFVar9->field_0x3)[lVar7] & 1) == 0) {
      if (9 < *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar9->type_)[lVar7] * 4) - 1U
         ) goto LAB_00f41956;
      this_00 = (FieldDescriptor *)(&pFVar9->super_SymbolBase + lVar7);
      this_02 = (DynamicMapField *)
                ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                (long)(int)(this->type_info_->offsets)._M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar14]);
      switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar9->type_)[lVar7] * 4)) {
      case 1:
        bVar5 = (&pFVar9->field_0x1)[lVar7];
        if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) {
LAB_00f41b8f:
          SharedCtor();
LAB_00f41ba4:
          SharedCtor();
LAB_00f41bb9:
          SharedCtor();
LAB_00f41bce:
          SharedCtor();
LAB_00f41be3:
          SharedCtor();
LAB_00f41bf8:
          SharedCtor();
LAB_00f41c0d:
          protobuf::internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb63);
        }
        goto LAB_00f41847;
      case 2:
        bVar5 = (&pFVar9->field_0x1)[lVar7];
        if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) {
          SharedCtor();
LAB_00f41b3a:
          SharedCtor();
LAB_00f41b4f:
          SharedCtor();
LAB_00f41b65:
          SharedCtor();
LAB_00f41b7a:
          SharedCtor();
          goto LAB_00f41b8f;
        }
        goto LAB_00f418d4;
      case 3:
        bVar5 = (&pFVar9->field_0x1)[lVar7];
        if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) goto LAB_00f41b7a;
LAB_00f41847:
        if ((bVar5 & 0x20) == 0) {
          *(undefined4 *)&(this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
               *(undefined4 *)((long)&pFVar9->field_20 + lVar7);
        }
        else {
LAB_00f41931:
          protobuf::internal::ShortSooRep::ShortSooRep((ShortSooRep *)this_02,(Arena *)local_58);
          if (((this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i & 4) != 0) {
LAB_00f41949:
            protobuf::internal::LongSooRep::elements((LongSooRep *)this_02);
          }
        }
        break;
      case 4:
        bVar5 = (&pFVar9->field_0x1)[lVar7];
        if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) goto LAB_00f41b3a;
LAB_00f418d4:
        if ((bVar5 & 0x20) == 0) {
          (this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
               *(TaggedPtr *)((long)&pFVar9->field_20 + lVar7);
          break;
        }
        goto LAB_00f41931;
      case 5:
        bVar5 = (&pFVar9->field_0x1)[lVar7];
        if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) goto LAB_00f41bb9;
        if ((bVar5 & 0x20) == 0) {
          (this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
               *(TaggedPtr *)((long)&pFVar9->field_20 + lVar7);
          break;
        }
        goto LAB_00f41931;
      case 6:
        bVar5 = (&pFVar9->field_0x1)[lVar7];
        if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) goto LAB_00f41bce;
        if ((bVar5 & 0x20) != 0) goto LAB_00f41931;
        *(undefined4 *)&(this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
             *(undefined4 *)((long)&pFVar9->field_20 + lVar7);
        break;
      case 7:
        bVar5 = (&pFVar9->field_0x1)[lVar7];
        if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) goto LAB_00f41b65;
        if ((bVar5 & 0x20) != 0) goto LAB_00f41931;
        *(undefined1 *)&(this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
             *(undefined1 *)((long)&pFVar9->field_20 + lVar7);
        break;
      case 8:
        bVar5 = (&pFVar9->field_0x1)[lVar7];
        if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) goto LAB_00f41ba4;
        if ((bVar5 & 0x20) == 0) {
          pEVar10 = FieldDescriptor::default_value_enum(this_00);
          *(int *)&(this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
               pEVar10->number_;
          break;
        }
        protobuf::internal::ShortSooRep::ShortSooRep((ShortSooRep *)this_02,(Arena *)local_58);
        if (((this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i & 4) == 0)
        break;
        goto LAB_00f41949;
      case 9:
        CVar6 = FieldDescriptor::cpp_string_type(this_00);
        if ((CVar6 == kView) || (CVar6 == kString)) {
          bVar5 = (&pFVar9->field_0x1)[lVar7];
          if (0xbf < bVar5 == (bool)((bVar5 & 0x20) >> 5)) {
            if ((bVar5 & 0x20) == 0) {
              (this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i =
                   (TaggedPtr)&protobuf::internal::fixed_address_empty_string;
            }
            else {
              (this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = 0;
              (this_02->super_MapFieldBase).super_MapFieldBaseForParse.prototype_as_void_ =
                   (void *)0x0;
              *(ThreadSafeArena **)&this_02->map_ = local_58;
            }
            break;
          }
          goto LAB_00f41be3;
        }
        if (CVar6 == kCord) {
          bVar5 = (&pFVar9->field_0x1)[lVar7];
          if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) goto LAB_00f41bf8;
          if ((bVar5 & 0x20) == 0) {
            if ((bVar5 & 1) == 0) {
              (this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = 0;
              (this_02->super_MapFieldBase).super_MapFieldBaseForParse.prototype_as_void_ =
                   (void *)0x0;
            }
            else {
              puVar3 = *(undefined8 **)((long)&pFVar9->field_20 + lVar7);
              src._M_str = (char *)*puVar3;
              src._M_len = puVar3[1];
              absl::lts_20250127::Cord::Cord((Cord *)this_02,src,kConstructorString);
            }
            if (local_58 != (ThreadSafeArena *)0x0) {
              cleanup = protobuf::internal::cleanup::arena_destruct_object<absl::lts_20250127::Cord>
              ;
              goto LAB_00f41ad5;
            }
          }
          else {
            protobuf::internal::ShortSooRep::ShortSooRep((ShortSooRep *)this_02,(Arena *)local_58);
            if (local_58 != (ThreadSafeArena *)0x0) {
              cleanup = protobuf::internal::cleanup::
                        arena_destruct_object<google::protobuf::RepeatedField<absl::lts_20250127::Cord>>
              ;
LAB_00f41ad5:
              protobuf::internal::ThreadSafeArena::AddCleanup(local_58,this_02,cleanup);
            }
          }
        }
        break;
      case 10:
        bVar5 = (&pFVar9->field_0x1)[lVar7];
        if (0xbf < bVar5 != (bool)((bVar5 & 0x20) >> 5)) goto LAB_00f41b4f;
        if ((bVar5 & 0x20) == 0) {
          (this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = 0;
        }
        else if (((&pFVar9->type_)[lVar7] == 0xb) &&
                (bVar4 = FieldDescriptor::is_map_message_type(this_00), bVar4)) {
          pDVar8 = FieldDescriptor::message_type(this_00);
          pFVar9 = Descriptor::map_value(pDVar8);
          local_50._24_8_ = FieldDescriptor::message_type(pFVar9);
          this_01 = this->type_info_->factory;
          pDVar8 = FieldDescriptor::message_type(this_00);
          if (local_50[0x14] == '\0') {
            default_entry = DynamicMessageFactory::GetPrototypeNoLock(this_01,pDVar8);
            if ((Descriptor *)local_50._24_8_ == (Descriptor *)0x0) goto LAB_00f41adf;
            mapped_default_entry_if_message =
                 DynamicMessageFactory::GetPrototypeNoLock
                           (this->type_info_->factory,(Descriptor *)local_50._24_8_);
          }
          else {
            iVar12 = (*(this_01->super_MessageFactory)._vptr_MessageFactory[2])(this_01,pDVar8);
            default_entry = (Message *)CONCAT44(extraout_var,iVar12);
            if ((Descriptor *)local_50._24_8_ == (Descriptor *)0x0) {
LAB_00f41adf:
              mapped_default_entry_if_message = (Message *)0x0;
            }
            else {
              iVar12 = (*(this->type_info_->factory->super_MessageFactory)._vptr_MessageFactory[2])
                                 ();
              mapped_default_entry_if_message = (Message *)CONCAT44(extraout_var_00,iVar12);
            }
          }
          protobuf::internal::DynamicMapField::DynamicMapField
                    (this_02,default_entry,mapped_default_entry_if_message,(Arena *)local_58);
        }
        else {
          (this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_._M_i = 0;
          (this_02->super_MapFieldBase).super_MapFieldBaseForParse.prototype_as_void_ = (void *)0x0;
          *(ThreadSafeArena **)&this_02->map_ = local_58;
        }
      }
LAB_00f41956:
      lVar14 = lVar14 + 1;
      lVar7 = lVar7 + 0x58;
      if (pDVar1->field_count_ <= lVar14) {
        return;
      }
    }
    if (((&pFVar9->field_0x1)[lVar7] & 0x10) == 0) goto LAB_00f41c0d;
    lVar2 = *(long *)((long)&pFVar9->scope_ + lVar7);
    if (lVar2 == 0) {
      protobuf::internal::protobuf_assumption_failed
                ("res != nullptr",
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                 ,0xb31);
    }
    if ((*(int *)(lVar2 + 4) != 1) || ((*(byte *)(*(long *)(lVar2 + 0x30) + 1) & 2) == 0))
    goto LAB_00f41956;
    this = (DynamicMessage *)local_50;
    SharedCtor(this);
    pTVar11 = extraout_RAX;
LAB_00f41b0f:
    local_58 = *(ThreadSafeArena **)((ulong)local_58 & 0xfffffffffffffffe);
  } while( true );
}

Assistant:

void DynamicMessage::SharedCtor(bool lock_factory) {
  // We need to call constructors for various fields manually and set
  // default values where appropriate.  We use placement new to call
  // constructors.  If you haven't heard of placement new, I suggest Googling
  // it now.  We use placement new even for primitive types that don't have
  // constructors for consistency.  (In theory, placement new should be used
  // any time you are trying to convert untyped memory to typed memory, though
  // in practice that's not strictly necessary for types that don't have a
  // constructor.)

  const Descriptor* descriptor = type_info_->class_data.descriptor;
  Arena* arena = GetArena();
  // Initialize oneof cases.
  int oneof_count = 0;
  for (int i = 0; i < descriptor->real_oneof_decl_count(); ++i) {
    new (MutableOneofCaseRaw(oneof_count++)) uint32_t{0};
  }

  if (type_info_->extensions_offset != -1) {
    new (MutableExtensionsRaw()) ExtensionSet(arena);
  }
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    void* field_ptr = MutableRaw(i);
    if (InRealOneof(field)) {
      continue;
    }
    switch (field->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE)                         \
  case FieldDescriptor::CPPTYPE_##CPPTYPE:                 \
    if (!field->is_repeated()) {                           \
      new (field_ptr) TYPE(field->default_value_##TYPE()); \
    } else {                                               \
      new (field_ptr) RepeatedField<TYPE>(arena);          \
    }                                                      \
    break;

      HANDLE_TYPE(INT32, int32_t);
      HANDLE_TYPE(INT64, int64_t);
      HANDLE_TYPE(UINT32, uint32_t);
      HANDLE_TYPE(UINT64, uint64_t);
      HANDLE_TYPE(DOUBLE, double);
      HANDLE_TYPE(FLOAT, float);
      HANDLE_TYPE(BOOL, bool);
#undef HANDLE_TYPE

      case FieldDescriptor::CPPTYPE_ENUM:
        if (!field->is_repeated()) {
          new (field_ptr) int{field->default_value_enum()->number()};
        } else {
          new (field_ptr) RepeatedField<int>(arena);
        }
        break;

      case FieldDescriptor::CPPTYPE_STRING:
        switch (field->cpp_string_type()) {
          case FieldDescriptor::CppStringType::kCord:
            if (!field->is_repeated()) {
              if (field->has_default_value()) {
                new (field_ptr) absl::Cord(field->default_value_string());
              } else {
                new (field_ptr) absl::Cord;
              }
              if (arena != nullptr) {
                // Cord does not support arena so here we need to notify arena
                // to remove the data it allocated on the heap by calling its
                // destructor.
                arena->OwnDestructor(static_cast<absl::Cord*>(field_ptr));
              }
            } else {
              new (field_ptr) RepeatedField<absl::Cord>(arena);
              if (arena != nullptr) {
                // Needs to destroy Cord elements.
                arena->OwnDestructor(
                    static_cast<RepeatedField<absl::Cord>*>(field_ptr));
              }
            }
            break;
          case FieldDescriptor::CppStringType::kView:
            if (internal::EnableExperimentalMicroString() &&
                !field->is_repeated()) {
              auto* str = ::new (MutableRaw<MicroString>(i)) MicroString();
              if (field->has_default_value()) {
                // TODO: Use an unowned block instead.
                str->Set(field->default_value_string(), arena);
              }
              break;
            }
            [[fallthrough]];
          case FieldDescriptor::CppStringType::kString:
            if (!field->is_repeated()) {
              ArenaStringPtr* asp = new (field_ptr) ArenaStringPtr();
              asp->InitDefault();
            } else {
              new (field_ptr) RepeatedPtrField<std::string>(arena);
            }
            break;
        }
        break;

      case FieldDescriptor::CPPTYPE_MESSAGE: {
        if (!field->is_repeated()) {
          new (field_ptr) Message*(nullptr);
        } else {
          if (IsMapFieldInApi(field)) {
            const auto* sub =
                field->message_type()->map_value()->message_type();
            // We need to lock in most cases to avoid data racing. Only not lock
            // when the constructor is called inside GetPrototype(), in which
            // case we have already locked the factory.
            new (field_ptr) DynamicMapField(
                lock_factory
                    ? type_info_->factory->GetPrototype(field->message_type())
                    : type_info_->factory->GetPrototypeNoLock(
                          field->message_type()),
                sub != nullptr
                    ? lock_factory
                          ? type_info_->factory->GetPrototype(sub)
                          : type_info_->factory->GetPrototypeNoLock(sub)
                    : nullptr,
                arena);
          } else {
            new (field_ptr) RepeatedPtrField<Message>(arena);
          }
        }
        break;
      }
    }
  }
}